

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareScalingFactorWithUnitBasedOnUnknownUnit_Test::TestBody
          (Units_compareScalingFactorWithUnitBasedOnUnknownUnit_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_168 [8];
  Message local_160 [8];
  double local_158;
  double local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  Message local_130 [8];
  double local_128;
  double local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  UnitsPtr u2;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr u1;
  Units_compareScalingFactorWithUnitBasedOnUnknownUnit_Test *this_local;
  
  u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"u1",&local_41);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"apple",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"",
             (allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar2,(int)local_78,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"u2",&local_d9);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Units::addUnit((StandardUnit)peVar2,0x10,1.0,1.0,(string *)0x0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_120 = 0.0;
  local_128 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)local_20,(shared_ptr *)local_b8,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_118,"0.0","libcellml::Units::scalingFactor(u1, u2)",&local_120
             ,&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x455,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_150 = 0.0;
  local_158 = (double)libcellml::Units::scalingFactor
                                ((shared_ptr *)local_b8,(shared_ptr *)local_20,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_148,"0.0","libcellml::Units::scalingFactor(u2, u1)",&local_150
             ,&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x456,pcVar3);
    testing::internal::AssertHelper::operator=(local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(local_168);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_b8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Units, compareScalingFactorWithUnitBasedOnUnknownUnit)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("apple", 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LUX, 0, 1.0, 1.0);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}